

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestParsingMerge::_InternalSerialize
          (TestParsingMerge *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestAllTypes *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t *puVar6;
  RepeatedPtrField<proto2_unittest::TestAllTypes> *this_00;
  const_reference this_01;
  uint8_t *puVar7;
  RepeatedPtrField<proto2_unittest::TestParsingMerge_RepeatedGroup> *this_02;
  const_reference value;
  TestParsingMerge *extendee;
  UnknownFieldSet *unknown_fields;
  uint local_44;
  uint n_1;
  uint i_1;
  TestAllTypes *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  TestParsingMerge *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestParsingMerge *this_local;
  
  puVar6 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar5 = *puVar6;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar5 & 1) != 0) {
    pTVar1 = (this->field_0)._impl_.required_all_types_;
    iVar3 = proto2_unittest::TestAllTypes::GetCachedSize((this->field_0)._impl_.required_all_types_)
    ;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)pTVar1,iVar3,target,stream);
  }
  if ((uVar5 & 2) != 0) {
    pTVar1 = (this->field_0)._impl_.optional_all_types_;
    iVar3 = proto2_unittest::TestAllTypes::GetCachedSize((this->field_0)._impl_.optional_all_types_)
    ;
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)pTVar1,iVar3,(uint8_t *)stream_local,stream);
  }
  local_30 = 0;
  uVar4 = _internal_repeated_all_types_size(this);
  for (; local_30 < uVar4; local_30 = local_30 + 1) {
    this_00 = _internal_repeated_all_types(this);
    this_01 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes>::Get
                        (this_00,local_30);
    iVar3 = proto2_unittest::TestAllTypes::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)this_01,iVar3,(uint8_t *)stream_local,stream);
  }
  if ((uVar5 & 4) != 0) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteGroup
                             (10,(MessageLite *)(this->field_0)._impl_.optionalgroup_,puVar7,stream)
    ;
  }
  local_44 = 0;
  uVar5 = _internal_repeatedgroup_size(this);
  for (; local_44 < uVar5; local_44 = local_44 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    this_02 = _internal_repeatedgroup(this);
    value = google::protobuf::RepeatedPtrField<proto2_unittest::TestParsingMerge_RepeatedGroup>::Get
                      (this_02,local_44);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteGroup
                             (0x14,(MessageLite *)value,puVar7,stream);
  }
  extendee = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)extendee,
                            (uint8_t *)stream_local,stream);
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestParsingMerge::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestParsingMerge& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestParsingMerge)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestAllTypes required_all_types = 1 [features = {
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.required_all_types_, this_._impl_.required_all_types_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestAllTypes optional_all_types = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.optional_all_types_, this_._impl_.optional_all_types_->GetCachedSize(), target,
        stream);
  }

  // repeated .proto2_unittest.TestAllTypes repeated_all_types = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_all_types_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_all_types().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // .proto2_unittest.TestParsingMerge.OptionalGroup optionalgroup = 10 [features = {
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        10, *this_._impl_.optionalgroup_, target, stream);
  }

  // repeated .proto2_unittest.TestParsingMerge.RepeatedGroup repeatedgroup = 20 [features = {
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeatedgroup_size());
       i < n; i++) {
    target = stream->EnsureSpace(target);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
            20, this_._internal_repeatedgroup().Get(i),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestParsingMerge)
  return target;
}